

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  long lVar1;
  void *pvVar2;
  long *in_RSI;
  long *in_RDI;
  long size;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  lVar1 = lodepng_filesize((char *)in_RSI);
  if (lVar1 < 0) {
    uVar3 = 0x4e;
  }
  else {
    *in_RSI = lVar1;
    pvVar2 = lodepng_malloc(0x1174c7);
    *in_RDI = (long)pvVar2;
    if ((*in_RDI == 0) && (0 < lVar1)) {
      uVar3 = 0x53;
    }
    else {
      uVar3 = lodepng_buffer_file((uchar *)CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),(size_t)in_RDI,
                                  (char *)in_RSI);
    }
  }
  return uVar3;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename)
{
	long size = lodepng_filesize(filename);
	if (size < 0) return 78;
	*outsize = (size_t)size;

	*out = (unsigned char*)lodepng_malloc((size_t)size);
	if (!(*out) && size > 0) return 83; /*the above malloc failed*/

	return lodepng_buffer_file(*out, (size_t)size, filename);
}